

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ImageButtonEx
               (ImGuiID id,ImTextureID texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
               ImVec4 *bg_col,ImVec4 *tint_col)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImDrawList *pIVar3;
  ImVec2 p_max;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  ImU32 IVar7;
  int iVar8;
  int idx;
  ImGuiContext *g;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  bool held;
  bool hovered;
  ImRect bb;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar4 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  pIVar2 = pIVar4->CurrentWindow;
  if (pIVar2->SkipItems == false) {
    IVar1 = (pIVar4->Style).FramePadding;
    fVar9 = IVar1.x;
    fVar11 = IVar1.y;
    bb.Min.x = (pIVar2->DC).CursorPos.x;
    bb.Min.y = (pIVar2->DC).CursorPos.y;
    bb.Max.x = fVar9 + fVar9 + (*size).x + bb.Min.x;
    bb.Max.y = fVar11 + fVar11 + (*size).y + bb.Min.y;
    ItemSize(&bb,-1.0);
    bVar6 = false;
    bVar5 = ItemAdd(&bb,id,(ImRect *)0x0,0);
    if (bVar5) {
      bVar6 = ButtonBehavior(&bb,id,&hovered,&held,0);
      iVar8 = ((held ^ 1U) & hovered) + 0x15;
      idx = 0x17;
      if ((hovered & 1U) == 0) {
        idx = iVar8;
      }
      if (held == false) {
        idx = iVar8;
      }
      IVar7 = GetColorU32(idx,1.0);
      RenderNavHighlight(&bb,id,1);
      IVar1.y = bb.Min.y;
      IVar1.x = bb.Min.x;
      p_max.y = bb.Max.y;
      p_max.x = bb.Max.x;
      fVar10 = fVar9;
      if (fVar11 <= fVar9) {
        fVar10 = fVar11;
      }
      fVar12 = (pIVar4->Style).FrameRounding;
      if (fVar10 <= fVar12) {
        fVar12 = fVar10;
      }
      RenderFrame(IVar1,p_max,IVar7,true,(float)(~-(uint)(fVar10 < 0.0) & (uint)fVar12));
      if (0.0 < bg_col->w) {
        pIVar3 = pIVar2->DrawList;
        local_38.y = bb.Min.y + fVar11;
        local_38.x = bb.Min.x + fVar9;
        local_40.x = bb.Max.x - fVar9;
        local_40.y = bb.Max.y - fVar11;
        IVar7 = GetColorU32(bg_col);
        ImDrawList::AddRectFilled(pIVar3,&local_38,&local_40,IVar7,0.0,0);
      }
      pIVar3 = pIVar2->DrawList;
      local_38.y = bb.Min.y + fVar11;
      local_38.x = bb.Min.x + fVar9;
      local_40.x = bb.Max.x - fVar9;
      local_40.y = bb.Max.y - fVar11;
      IVar7 = GetColorU32(tint_col);
      ImDrawList::AddImage(pIVar3,texture_id,&local_38,&local_40,uv0,uv1,IVar7);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ImGui::ImageButtonEx(ImGuiID id, ImTextureID texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImVec2 padding = g.Style.FramePadding;
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size + padding * 2.0f);
    ItemSize(bb);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, ImClamp((float)ImMin(padding.x, padding.y), 0.0f, g.Style.FrameRounding));
    if (bg_col.w > 0.0f)
        window->DrawList->AddRectFilled(bb.Min + padding, bb.Max - padding, GetColorU32(bg_col));
    window->DrawList->AddImage(texture_id, bb.Min + padding, bb.Max - padding, uv0, uv1, GetColorU32(tint_col));

    return pressed;
}